

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O1

QCborMap __thiscall QCborMap::fromVariantHash(QCborMap *this,QVariantHash *hash)

{
  byte bVar1;
  QCborContainerPrivate *this_00;
  Entry *pEVar2;
  ulong uVar3;
  uint uVar4;
  size_t reserved;
  ulong uVar5;
  Data *pDVar6;
  QStringView s;
  
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborMap(this);
  if (hash->d == (Data *)0x0) {
    reserved = 0;
  }
  else {
    reserved = hash->d->size;
  }
  detach(this,reserved);
  pDVar6 = hash->d;
  if (pDVar6 == (Data *)0x0) {
    pDVar6 = (Data *)0x0;
  }
  else if (pDVar6->spans->offsets[0] == 0xff) {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (pDVar6->numBuckets == uVar5) {
        pDVar6 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar3 = uVar5 + 1;
    } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    goto LAB_002f42af;
  }
  uVar5 = 0;
LAB_002f42af:
  if (pDVar6 != (Data *)0x0 || uVar5 != 0) {
    this_00 = (this->d).d.ptr;
    do {
      uVar3 = uVar5 >> 7;
      uVar4 = (uint)uVar5 & 0x7f;
      pEVar2 = pDVar6->spans[uVar3].entries;
      bVar1 = pDVar6->spans[uVar3].offsets[uVar4];
      s.m_data = *(storage_type_conflict **)(pEVar2[bVar1].storage.data + 8);
      s.m_size = *(qsizetype *)(pEVar2[bVar1].storage.data + 0x10);
      QCborContainerPrivate::append(this_00,s);
      appendVariant(this_00,(QVariant *)
                            (pDVar6->spans[uVar3].entries[pDVar6->spans[uVar3].offsets[uVar4]].
                             storage.data + 0x18));
      do {
        if (pDVar6->numBuckets - 1 == uVar5) {
          pDVar6 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar6->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((pDVar6 != (Data *)0x0) || (uVar5 != 0));
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QCborMap QCborMap::fromVariantHash(const QVariantHash &hash)
{
    QCborMap m;
    m.detach(hash.size());
    QCborContainerPrivate *d = m.d.data();

    auto it = hash.begin();
    auto end = hash.end();
    for ( ; it != end; ++it) {
        d->append(it.key());
        appendVariant(d, it.value());
    }
    return m;
}